

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O2

cmCommand * __thiscall cmCTestUpdateCommand::Clone(cmCTestUpdateCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0xa8);
  cmCTestUpdateCommand((cmCTestUpdateCommand *)this_00);
  pcVar1 = (cmMakefile *)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler
  ;
  this_00[1]._vptr_cmCommand =
       (_func_int **)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  this_00[1].Makefile = pcVar1;
  return this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestUpdateCommand* ni = new cmCTestUpdateCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }